

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_acode(compiler_state_t *cstate,u_char *eaddr,qual q)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  code *pcVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  uint reverse;
  long lVar8;
  compiler_state_t *pcVar9;
  block *pbVar10;
  slist *psVar11;
  block *pbVar12;
  bpf_u_int32 bVar13;
  u_int offset;
  u_int unaff_EBX;
  undefined1 *puVar14;
  int *piVar15;
  undefined1 *puVar16;
  compiler_state_t **ppcVar17;
  long unaff_RBP;
  e_offrel eVar18;
  char *pcVar19;
  uint in_R8D;
  bpf_u_int32 bVar20;
  bpf_u_int32 bVar21;
  bpf_u_int32 in_R9D;
  bpf_u_int32 jtype;
  bpf_int32 in_R10D;
  long in_R11;
  compiler_state_t *unaff_R12;
  u_int unaff_R13D;
  bpf_int32 unaff_R14D;
  compiler_state_t *unaff_R15;
  compiler_state_t *in_stack_00000008;
  compiler_state_t *pcStackY_40;
  
  ppcVar17 = (compiler_state_t **)&stack0xffffffffffffffe8;
  puVar14 = &stack0xffffffffffffffe8;
  if ((cstate->linktype != 0x81) && (cstate->linktype != 7)) {
    pcVar19 = "aid supported only on ARCnet";
    goto LAB_001103af;
  }
  if (((uint)q & 0xfffe) != 0x100) {
    pcVar19 = "ARCnet address used in non-arc expression";
    goto LAB_001103af;
  }
  bVar13 = (uint)q >> 0x10;
  if (10 < q.dir) {
    abort();
  }
  uVar7 = bVar13 & 0xff;
  bVar20 = 0x120cb4;
  uVar3 = (&switchD_001102ad::switchdataD_00120cb4)[uVar7];
  lVar8 = (long)(int)uVar3;
  pcVar9 = (compiler_state_t *)((long)&switchD_001102ad::switchdataD_00120cb4 + lVar8);
  cVar6 = (char)pcVar9;
  reverse = (uint)pcVar9;
  eVar18 = (e_offrel)eaddr;
  switch(uVar7) {
  default:
    pbVar12 = gen_bcmp(cstate,OR_LINKHDR,0,1,eaddr);
    pbVar10 = gen_bcmp(cstate,OR_LINKHDR,1,1,eaddr);
    gen_or(pbVar12,pbVar10);
    return pbVar10;
  case 1:
    offset = 0;
    goto LAB_00110357;
  case 2:
    offset = 1;
LAB_00110357:
    pbVar12 = gen_bcmp(cstate,OR_LINKHDR,offset,1,eaddr);
    return pbVar12;
  case 4:
    pbVar12 = gen_bcmp(cstate,OR_LINKHDR,0,1,eaddr);
    pbVar10 = gen_bcmp(cstate,OR_LINKHDR,1,1,eaddr);
    gen_and(pbVar12,pbVar10);
    return pbVar10;
  case 5:
    pcVar19 = "\'addr1\' is only supported on 802.11";
    break;
  case 6:
    pcVar19 = "\'addr2\' is only supported on 802.11";
    break;
  case 7:
    pcVar19 = "\'addr3\' is only supported on 802.11";
    break;
  case 8:
    pcVar19 = "\'addr4\' is only supported on 802.11";
    break;
  case 9:
    pcVar19 = "\'ra\' is only supported on 802.11";
    break;
  case 10:
    pcVar19 = "\'ta\' is only supported on 802.11";
    break;
  case 0xb:
    UINT_00120c3c = 0xfffee48d;
    switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
    return (block *)pcVar9;
  case 0xc:
    bVar20 = 0xf;
    goto LAB_00110e39;
  case 0xd:
    if (pcVar9 != (compiler_state_t *)0x0 && SCARRY8(lVar8,0x120cb4) == (long)pcVar9 < 0) {
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    }
    UINT_00120c3c = 0xfffee48c;
    switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
    halt_baddata();
  case 0xe:
    if (pcVar9 == (compiler_state_t *)0x0) {
      bpf_error(cstate,"\'callref\' supported only on raw ATM");
    }
    bVar13 = cstate->off_proto;
    if (bVar13 == 0xffffffff) {
      abort();
    }
    bVar20 = 0xffffffff;
LAB_00110e39:
    pbVar12 = gen_ncmp(cstate,OR_LINKHDR,bVar13,0x10,bVar20,in_R9D,reverse,in_R10D);
    return pbVar12;
  case 0xf:
    UINT_00120c3c = 0xfffec98d;
    pbVar12 = (block *)(*(code *)((long)&switchD_00110db1::switchdataD_00120ce0 +
                                 (long)(int)(&switchD_00110db1::switchdataD_00120ce0)[(long)eaddr]))
                                 (cstate,eaddr,
                                  (code *)((long)&switchD_00110db1::switchdataD_00120ce0 +
                                          (long)(int)(&switchD_00110db1::switchdataD_00120ce0)
                                                     [(long)eaddr]));
    return pbVar12;
  case 0x10:
    pbVar12 = (block *)((ulong)pcVar9 | 0x31);
    pbVar12->sense = (int)CONCAT71(0x120c,pbVar12->sense == 0);
    return pbVar12;
  case 0x11:
    puVar14 = (undefined1 *)0x0;
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar6;
    if ((1 < uVar3 + 0x120c29) && (reverse != 0xc5)) {
      pcVar19 = "\'hfisu\' supported only on MTP2_HSL";
LAB_0011115f:
      *(code **)(puVar14 + -8) = gen_mtp3field_code;
      bpf_error(cstate,pcVar19);
    }
    bVar13 = cstate->off_li_hsl;
    bVar20 = 8;
    bVar21 = 0xff80;
    jtype = 0x10;
    uRamfffffffffffffff8 = 0;
    piVar15 = (int *)&uRamfffffffffffffff0;
    uRamfffffffffffffff0 = 0;
    goto LAB_00111117;
  case 0x12:
    pcVar9 = (compiler_state_t *)gen_ncmp(cstate,eVar18,bVar13,0x120cb4,0xff80,0x20,1,0x100);
    puVar16 = &stack0xffffffffffffffe8;
    bVar13 = cstate->off_li_hsl;
    bVar20 = 8;
    bVar21 = 0xff80;
    goto LAB_001110b9;
  case 0x13:
    pcVar19 = (char *)((long)cstate[0x51].top_ctx[0].__saved_mask.__val + 0x6b);
    *pcVar19 = *pcVar19 + -0x4c;
    *(char *)(unaff_RBP + -0x8a78) = *(char *)(unaff_RBP + -0x8a78) + -0x4c;
    piVar1 = (int *)((long)cstate[0x411c8].top_ctx[0].__saved_mask.__val + 0x31);
    *piVar1 = *piVar1 + 1;
    if (reverse != 0xc5) {
      pcVar19 = "\'msu\' supported only on MTP2";
      goto LAB_0011115f;
    }
    bVar13 = cstate->off_li;
    bVar20 = 0x10;
    bVar21 = 0x3f;
    jtype = 0x20;
    piVar15 = (int *)&stack0xffffffffffffffd8;
LAB_00111117:
    piVar15[-2] = 0x11111c;
    piVar15[-1] = 0;
    pbVar12 = gen_ncmp(cstate,OR_PACKET,bVar13,bVar20,bVar21,jtype,*piVar15,piVar15[2]);
    return pbVar12;
  case 0x14:
    switch(uVar7) {
    default:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 1:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 2:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 4:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 5:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 6:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 7:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 8:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 9:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 10:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0xb:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0xc:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0xd:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0xe:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0xf:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x10:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x11:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x12:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x13:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x14:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x15:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x16:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x17:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x18:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x19:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x1a:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x1b:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x1c:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x1d:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x1e:
    case 0x21:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x1f:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x20:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x22:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x23:
    case 0x26:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x24:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x25:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x27:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x28:
    case 0x2b:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x29:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x2a:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    case 0x2c:
      UINT_00120c3c = 0xfffee48d;
      switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
      halt_baddata();
    }
  case 0x15:
    puVar16 = &stack0xfffffffffffffff8;
    bVar13 = cstate->off_li;
    bVar20 = 0x10;
    bVar21 = 0x3f;
LAB_001110b9:
    *(compiler_state_t **)(puVar16 + -8) = unaff_R15;
    *(compiler_state_t **)(puVar16 + -0x10) = unaff_R15;
    *(undefined8 *)(puVar16 + -0x18) = 0x1110c8;
    pbVar12 = gen_ncmp(cstate,OR_PACKET,bVar13,bVar20,bVar21,0x20,*(int *)(puVar16 + -0x10),
                       *(bpf_int32 *)(puVar16 + -8));
    *(undefined8 *)(puVar16 + -8) = 0x1110d7;
    gen_and(pbVar12,(block *)pcVar9);
    return (block *)pcVar9;
  case 0x16:
    UINT_00120c3c = 0xfffee48d;
    switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
    halt_baddata();
  case 0x17:
    *(int *)cstate->top_ctx[0].__jmpbuf = (int)cstate->top_ctx[0].__jmpbuf[0] + -1;
    goto code_r0x001111c9;
  case 0x18:
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar6;
    pcVar9 = (compiler_state_t *)(ulong)(reverse << 4);
    eaddr = (u_char *)0x0;
    in_R8D = (uint)in_R11;
    bVar20 = 0x10;
    goto code_r0x0011120d;
  case 0x19:
    *(uint *)pcVar9->top_ctx[0].__jmpbuf = (int)pcVar9->top_ctx[0].__jmpbuf[0] + reverse;
    goto code_r0x00111197;
  case 0x1a:
    UINT_00120c3c = 0xfffee48d;
    switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
    halt_baddata();
  case 0x1b:
    pcVar9 = (compiler_state_t *)(ulong)(reverse + *(int *)(in_R11 + -0x7bf00005));
code_r0x001111c9:
    bVar5 = (byte)pcVar9;
    switchD_001102ad::switchdataD_00120cb4._0_1_ = bVar5 - 5;
    lVar8 = pcVar9->top_ctx[0].__jmpbuf[0];
    *(byte *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + bVar5;
    if (!CARRY1((byte)lVar8,bVar5)) {
      bpf_error(cstate,"sio value %u too big; max value = 255",(ulong)pcVar9 & 0xffffffff);
    }
    eVar18 = OR_PACKET;
    bVar20 = 0x10;
    bVar13 = 0xffffffff;
LAB_0011126f:
    pbVar12 = gen_ncmp(cstate,eVar18,in_R8D,bVar20,bVar13,in_R9D,in_R10D,(bpf_int32)pcVar9);
    return pbVar12;
  case 0x1c:
    *(char *)cstate->top_ctx[0].__jmpbuf = (char)cstate->top_ctx[0].__jmpbuf[0] + -0x4c;
    *(uint *)(unaff_RBP + -0x3f000000) = *(uint *)(unaff_RBP + -0x3f000000) ^ 0xffffffe0;
    cVar6 = cVar6 + '1';
    pcVar9 = (compiler_state_t *)CONCAT71((int7)((ulong)pcVar9 >> 8),cVar6);
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar6;
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar6;
    in_R8D = bVar13;
code_r0x0011120d:
    eVar18 = (e_offrel)eaddr;
    bVar13 = 0xf0;
    goto LAB_0011126f;
  case 0x1d:
    pcVar19 = (char *)((long)cstate[0x19ab].regused + 0x1b);
    cVar2 = *pcVar19;
    *pcVar19 = *pcVar19 + cVar6;
    if (!SCARRY1(cVar2,cVar6)) goto code_r0x00111196;
code_r0x00111197:
    pcVar19 = (char *)((long)cstate[0x19ab].regused + 3);
    *pcVar19 = *pcVar19 + cVar6;
    if (*pcVar19 == '\0') {
      pcVar19 = (char *)((long)&UINT_00120c40 + lVar8 + 1);
      *pcVar19 = *pcVar19 + -0x4c;
      pcVar9 = (compiler_state_t *)(ulong)(reverse | 0xfb66);
    }
    else {
      *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar6;
    }
code_r0x00111196:
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + (char)pcVar9;
    pbVar12 = (block *)(*(code *)((long)&switchD_001111b9::switchdataD_00120d0c +
                                 (long)(int)(&switchD_001111b9::switchdataD_00120d0c)[(long)eaddr]))
                                 (cstate,(code *)((long)&switchD_001111b9::switchdataD_00120d0c +
                                                 (long)(int)(&switchD_001111b9::switchdataD_00120d0c
                                                            )[(long)eaddr]),
                                  (ulong)eaddr & 0xffffffff,(ulong)unaff_R15 & 0xffffffff,
                                  (ulong)cstate & 0xffffffff);
    return pbVar12;
  case 0x1e:
  case 0x21:
    psVar11 = gen_load_a(cstate,eVar18,bVar13,0x120cb4);
    pbVar12 = (block *)newchunk((compiler_state_t *)eaddr,0x120);
    (pbVar12->s).code = 0x25;
    pbVar12->head = pbVar12;
    pbVar12->stmts = psVar11;
    (pbVar12->s).k = (bpf_u_int32)cstate;
    pbVar12->sense = (uint)(pbVar12->sense == 0);
    return pbVar12;
  case 0x1f:
    pcVar9 = unaff_R15;
    goto code_r0x001123ea;
  case 0x20:
    pcVar9 = (compiler_state_t *)((ulong)cstate & 0xffffffff);
    unaff_R13D = unaff_EBX;
code_r0x001123ea:
    pbVar12 = gen_hostop(pcVar9,eVar18,(bpf_u_int32)cstate,2,(int)unaff_RBP,(u_int)unaff_R12,
                         unaff_R13D);
    gen_or((block *)unaff_R15,pbVar12);
    return pbVar12;
  case 0x22:
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar6;
    pcVar4 = (code *)swi(3);
    pbVar12 = (block *)(*pcVar4)();
    return pbVar12;
  case 0x23:
  case 0x26:
    unaff_R12 = cstate;
    goto LAB_00112498;
  case 0x24:
    if (4 < bVar13) {
      if (bVar13 != 0x18) {
        abort();
      }
      bpf_error(cstate,"ISO host filtering not implemented");
    }
    goto code_r0x001124dc;
  case 0x25:
    bVar13 = reverse + (int)pcVar9->top_ctx[0].__jmpbuf[0];
    cRam0000000048e296a9 = cRam0000000048e296a9 + -0x4c;
code_r0x001124dc:
    pbVar12 = (block *)(*(code *)((long)&switchD_001124e3::switchdataD_00120d40 +
                                 (long)(int)(&switchD_001124e3::switchdataD_00120d40)[bVar13]))();
    return pbVar12;
  case 0x27:
    pcVar9 = (compiler_state_t *)
             gen_ncmp(cstate,eVar18,bVar13,0x120cb4,in_R8D,in_R9D,unaff_EBX,unaff_R14D);
    cstate = pcVar9;
LAB_00112498:
    gen_and((block *)unaff_R12,(block *)pcVar9);
    return (block *)cstate;
  case 0x28:
  case 0x2b:
    pbVar12 = (block *)newchunk((compiler_state_t *)((ulong)cstate & 0xffffffff),(size_t)eaddr);
    (pbVar12->s).code = 0x15;
    pbVar12->head = pbVar12;
    pbVar12->stmts = (slist *)unaff_R12;
    (pbVar12->s).k = unaff_R13D;
    gen_and((block *)eaddr,pbVar12);
    gen_or(pbVar12,(block *)unaff_R15);
    cstate = in_stack_00000008;
  case 0x2c:
    gen_and((block *)cstate,(block *)unaff_R15);
    return (block *)unaff_R15;
  case 0x29:
    ppcVar17 = &pcStackY_40;
    pcStackY_40 = cstate;
  case 0x2a:
    *(compiler_state_t **)((long)ppcVar17 + -8) = pcVar9;
    *(code **)((long)ppcVar17 + -0x10) = gen_geneve_check;
    abort();
  case 0x2d:
    UINT_00120c3c = 0xfffee48d;
    switchD_001102ad::switchdataD_00120cb4._0_1_ = 0xfb;
    halt_baddata();
  }
LAB_001103af:
  bpf_error(cstate,pcVar19);
}

Assistant:

struct block *
gen_acode(compiler_state_t *cstate, const u_char *eaddr, struct qual q)
{
	switch (cstate->linktype) {

	case DLT_ARCNET:
	case DLT_ARCNET_LINUX:
		if ((q.addr == Q_HOST || q.addr == Q_DEFAULT) &&
		    q.proto == Q_LINK)
			return (gen_ahostop(cstate, eaddr, (int)q.dir));
		else {
			bpf_error(cstate, "ARCnet address used in non-arc expression");
			/* NOTREACHED */
		}
		break;

	default:
		bpf_error(cstate, "aid supported only on ARCnet");
		/* NOTREACHED */
	}
	bpf_error(cstate, "ARCnet address used in non-arc expression");
	/* NOTREACHED */
	return NULL;
}